

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall chatra::RuntimeImp::enqueue(RuntimeImp *this,Thread *thread)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  Thread *thread_local;
  
  lock._8_8_ = thread;
  if (this->multiThread == true) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mtQueue);
    std::deque<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>::push_back
              (&this->queue,(value_type *)&lock._M_owns);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  }
  else {
    SpinLock::lock(&this->lockQueue);
    std::deque<chatra::Thread_*,_std::allocator<chatra::Thread_*>_>::push_back
              (&this->queue,(value_type *)&lock._M_owns);
    (this->lockQueue).flag.super___atomic_flag_base._M_i = false;
  }
  return;
}

Assistant:

void RuntimeImp::enqueue(Thread* thread) {
	chatra_assert(thread != nullptr);

	/*std::printf("enqueue: instanceId %u, threadId = %u; frames.size = %u\n",
			static_cast<unsigned>(thread->instance.getId()),
			static_cast<unsigned>(thread->getId()),
			static_cast<unsigned>(thread->frames.size()));
	std::fflush(stdout);*/

	/*{
		static unsigned count = 0;
		static constexpr unsigned breakCount = std::numeric_limits<unsigned>::max();  // std::numeric_limits<unsigned>::max()
		std::unique_lock<std::mutex> lock(mtQueue);
		count++;
		if (count == breakCount)
			chatra_assert(false);
		for (auto* t : queue)
			chatra_assert(t != thread);
	}*/

	if (multiThread) {
		std::unique_lock<std::mutex> lock(mtQueue);
		queue.push_back(thread);
		cvQueue.notify_one();
	}
	else {
		std::lock_guard<SpinLock> lock(lockQueue);
		queue.push_back(thread);
	}
}